

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckDirectApi<cfd::js::api::json::FundRawTransactionRequest,cfd::js::api::json::FundRawTransactionResponse>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
          *bitcoin_function,
          function<void_(cfd::js::api::json::FundRawTransactionRequest_*,_cfd::js::api::json::FundRawTransactionResponse_*)>
          *elements_function)

{
  pointer pcVar1;
  CfdException *cfde;
  undefined1 auVar2 [12];
  CfdException ex;
  FundRawTransactionResponse response;
  FundRawTransactionRequest req;
  FundRawTransactionResponse *local_2b8;
  FundRawTransactionRequest *local_2b0;
  string local_2a8;
  ErrorResponse local_278;
  FundRawTransactionRequest local_1c0;
  
  FundRawTransactionRequest::FundRawTransactionRequest(&local_1c0);
  core::JsonClassBase<cfd::js::api::json::FundRawTransactionRequest>::Deserialize
            (&local_1c0.super_JsonClassBase<cfd::js::api::json::FundRawTransactionRequest>,
             (string *)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  FundRawTransactionResponse::FundRawTransactionResponse((FundRawTransactionResponse *)&local_278);
  local_2b8 = (FundRawTransactionResponse *)&local_278;
  local_2b0 = &local_1c0;
  if (local_1c0.is_elements_ == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_005f6b63:
      auVar2 = std::__throw_bad_function_call();
      FundRawTransactionResponse::~FundRawTransactionResponse
                ((FundRawTransactionResponse *)&local_278);
      if (auVar2._8_4_ != 2) {
        pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &__return_storage_ptr__->field_2) {
          operator_delete(pcVar1);
        }
        FundRawTransactionRequest::~FundRawTransactionRequest(&local_1c0);
        _Unwind_Resume(auVar2._0_8_);
      }
      cfde = (CfdException *)__cxa_begin_catch(auVar2._0_8_);
      ErrorResponse::ConvertFromCfdException(&local_278,cfde);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_2a8,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_278);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      local_278.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_278.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_278.super_ErrorResponseBase.ignore_items._M_t);
      __cxa_end_catch();
      goto LAB_005f6b41;
    }
    (*bitcoin_function->_M_invoker)((_Any_data *)bitcoin_function,&local_2b0,&local_2b8);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f6b63;
    (**(code **)((long)&request_message->field_2 + 8))(request_message,&local_2b0,&local_2b8);
  }
  core::JsonClassBase<cfd::js::api::json::FundRawTransactionResponse>::Serialize_abi_cxx11_
            (&local_2a8,(JsonClassBase<cfd::js::api::json::FundRawTransactionResponse> *)&local_278)
  ;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  FundRawTransactionResponse::~FundRawTransactionResponse((FundRawTransactionResponse *)&local_278);
LAB_005f6b41:
  FundRawTransactionRequest::~FundRawTransactionRequest(&local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckDirectApi(
    const std::string &request_message,
    std::function<void(RequestType *, ResponseType *)>
        bitcoin_function,  // NOLINT
    std::function<void(RequestType *, ResponseType *)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }

  std::string json_message;
  try {
    ResponseType response;

    if (req.GetIsElements()) {
#ifndef CFD_DISABLE_ELEMENTS
      elements_function(&req, &response);
#else
      CfdException ex(
          CfdError::kCfdIllegalArgumentError, "functionType not supported.");
      ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
      return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
    } else {
#ifndef CFD_DISABLE_BITCOIN
      bitcoin_function(&req, &response);
#else
      CfdException ex(
          CfdError::kCfdIllegalArgumentError, "functionType not supported.");
      ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
      return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
    }

    json_message = response.Serialize();
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    json_message = res.Serialize();
  }

  // utf-8
  return json_message;
}